

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestIO.h
# Opt level: O1

string * BuildRelativeInputPath(string *__return_storage_ptr__,char **argv,string *inRelativeURL)

{
  allocator<char> local_59;
  string local_58;
  FileURL local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,argv[1],&local_59);
  LocalPathToFileURL(&local_38,&local_58);
  RelativeURLToLocalPath(__return_storage_ptr__,&local_38,inRelativeURL);
  FileURL::~FileURL(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static string BuildRelativeInputPath(char* argv[], const string& inRelativeURL)
{
    return RelativeURLToLocalPath(LocalPathToFileURL(argv[1]), inRelativeURL);
}